

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void transition(tgestate_t *state,mappos8_t *mappos)

{
  room_t rVar1;
  vischar_t *vischar;
  uint16_t uVar2;
  
  vischar = state->IY;
  if (vischar->room == '\0') {
    (vischar->mi).mappos.u = (ushort)mappos->u << 2;
    (vischar->mi).mappos.v = (ushort)mappos->v << 2;
    uVar2 = (ushort)mappos->w << 2;
  }
  else {
    (vischar->mi).mappos.u = (ushort)mappos->u;
    (vischar->mi).mappos.v = (ushort)mappos->v;
    uVar2 = (uint16_t)mappos->w;
  }
  (vischar->mi).mappos.w = uVar2;
  if (vischar != state->vischars) {
    reset_visible_character(state,vischar);
    return;
  }
  vischar->flags = vischar->flags & 0x7f;
  rVar1 = state->vischars[0].room;
  state->room_index = rVar1;
  if (rVar1 == '\0') {
    vischar->input = 0x80;
    vischar->direction = vischar->direction & 3;
    reset_outdoors(state);
    longjmp((__jmp_buf_tag *)state->jmpbuf_main,1);
  }
  enter_room(state);
}

Assistant:

void transition(tgestate_t *state, const mappos8_t *mappos)
{
  vischar_t *vischar;    /* was IY */
  room_t     room_index; /* was A */

  assert(state  != NULL);
  assert(mappos != NULL);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  if (vischar->room == room_0_OUTDOORS)
  {
    /* Outdoors */

    /* Set position on X axis, Y axis and height (multiplying by 4). */

    /* Conv: This was unrolled (compared to the original) to avoid having to
     * access the structure as an array. */
    vischar->mi.mappos.u = mappos->u * 4;
    vischar->mi.mappos.v = mappos->v * 4;
    vischar->mi.mappos.w = mappos->w * 4;
  }
  else
  {
    /* Indoors */

    /* Set position on X axis, Y axis and height (copying). */

    /* Conv: This was unrolled (compared to the original) to avoid having to
     * access the structure as an array. */
    vischar->mi.mappos.u = mappos->u;
    vischar->mi.mappos.v = mappos->v;
    vischar->mi.mappos.w = mappos->w;
  }

  if (vischar != &state->vischars[0])
  {
    /* Not the hero. */

    reset_visible_character(state, vischar); /* was tail call */
  }
  else
  {
    /* Hero only. */

    vischar->flags &= ~vischar_FLAGS_NO_COLLIDE;
    state->room_index = room_index = state->vischars[0].room;
    if (room_index == room_0_OUTDOORS)
    {
      /* Outdoors */

      vischar->input = input_KICK;
      vischar->direction &= vischar_DIRECTION_MASK; /* clear crawl flag */
      reset_outdoors(state);
      squash_stack_goto_main(state); /* was tail call */
    }
    else
    {
      /* Indoors */

      enter_room(state); /* was fallthrough */
    }
    NEVER_RETURNS;
  }
}